

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O3

uint8_t gb_read_none(MemoryBankController *mc,uint16_t address)

{
  ulong uVar1;
  
  if (-1 < (short)address) {
    return mc->rom[address];
  }
  if ((address & 0xe000) != 0xa000) {
    uVar1 = (ulong)(address - 0xff00);
    if (0x20 < address - 0xff00) {
LAB_001020eb:
      return mc->memory[address];
    }
    if ((0x129000002U >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 != 0) {
        if (uVar1 == 0xf) {
          return mc->memory[0xff0f] | 0xe0;
        }
        goto LAB_001020eb;
      }
      if ((mc->memory[0xff00] & 0x20) == 0) {
        return mc->buttons >> 4;
      }
      if ((mc->memory[0xff00] & 0x10) == 0) {
        return mc->buttons;
      }
    }
  }
  return 0xff;
}

Assistant:

uint8_t gb_read_none(MemoryBankController* mc, uint16_t address) {

    if(address <= 0x7FFF) {
        return mc->rom[address];
    }

    //No licensed games use rom+ram, so we just return 0xFF     
    if (address >= 0xA000 && address <= 0xBFFF) {
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}